

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall chaiscript::detail::Dispatch_Function::~Dispatch_Function(Dispatch_Function *this)

{
  ~Dispatch_Function(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~Dispatch_Function() {}